

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

u32string * __thiscall
cs::codecvt::gbk::local2wide_abi_cxx11_
          (u32string *__return_storage_ptr__,gbk *this,deque<char,_std::allocator<char>_> *local)

{
  bool bVar1;
  byte *pbVar2;
  compile_error *this_00;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  _Map_pointer ppcVar6;
  u32string wide;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_78;
  u32string *local_58;
  string local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = L'\0';
  pbVar2 = (byte *)(local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
  if (pbVar2 != (byte *)(local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                        super__Deque_impl_data._M_finish._M_cur) {
    pbVar4 = (byte *)(local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                     super__Deque_impl_data._M_start._M_last;
    ppcVar6 = (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_node;
    bVar1 = true;
    uVar3 = 0;
    local_58 = __return_storage_ptr__;
    do {
      pbVar5 = pbVar2 + 1;
      if (bVar1) {
        if (pbVar5 == pbVar4) {
          pbVar5 = (byte *)ppcVar6[1];
          ppcVar6 = ppcVar6 + 1;
          pbVar4 = pbVar5 + 0x200;
        }
        uVar3 = (uint)(char)*pbVar2;
        if ((char)*pbVar2 < '\0') {
          bVar1 = false;
          pbVar2 = pbVar5;
        }
        else {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (&local_78,uVar3 & 0xff7f);
          pbVar2 = pbVar5;
        }
      }
      else {
        if (pbVar5 == pbVar4) {
          pbVar5 = (byte *)ppcVar6[1];
          ppcVar6 = ppcVar6 + 1;
          pbVar4 = pbVar5 + 0x200;
        }
        bVar1 = true;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(&local_78,(uVar3 & 0xff) << 8 | (uint)*pbVar2);
        pbVar2 = pbVar5;
      }
    } while (pbVar2 != (byte *)(local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                               super__Deque_impl_data._M_finish._M_cur);
    __return_storage_ptr__ = local_58;
    if (!bVar1) {
      this_00 = (compile_error *)__cxa_allocate_exception(0x28);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Codecvt: Bad encoding.","");
      compile_error::compile_error(this_00,&local_50);
      __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_78._M_dataplus._M_p == &local_78.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT44(local_78.field_2._M_local_buf[1],local_78.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT44(local_78.field_2._M_local_buf[1],local_78.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_78._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::u32string local2wide(const std::deque<char> &local) override
			{
				std::u32string wide;
				uint32_t head = 0;
				bool read_next = true;
				for (auto it = local.begin(); it != local.end();) {
					if (read_next) {
						head = *(it++);
						if (head & u8_blck_begin)
							read_next = false;
						else
							wide.push_back(set_zero(head));
					}
					else {
						std::uint8_t tail = *(it++);
						wide.push_back(set_zero(head << 8 | tail));
						read_next = true;
					}
				}
				if (!read_next)
					throw compile_error("Codecvt: Bad encoding.");
				return std::move(wide);
			}